

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

void __thiscall cmake::GenerateGraphViz(cmake *this,char *fileName)

{
  pointer pcVar1;
  string *psVar2;
  string fallbackSettingsFile;
  string settingsFile;
  cmGraphVizWriter gvWriter;
  long *local_170 [2];
  long local_160 [2];
  long *local_150 [2];
  long local_140 [2];
  cmGraphVizWriter local_130;
  
  cmGraphVizWriter::cmGraphVizWriter(&local_130,this->GlobalGenerator);
  psVar2 = cmState::GetBinaryDirectory_abi_cxx11_(this->State);
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  local_150[0] = local_140;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_150,pcVar1,pcVar1 + psVar2->_M_string_length);
  std::__cxx11::string::append((char *)local_150);
  psVar2 = cmState::GetSourceDirectory_abi_cxx11_(this->State);
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  local_170[0] = local_160;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_170,pcVar1,pcVar1 + psVar2->_M_string_length);
  std::__cxx11::string::append((char *)local_170);
  cmGraphVizWriter::ReadSettings(&local_130,(char *)local_150[0],(char *)local_170[0]);
  cmGraphVizWriter::WritePerTargetFiles(&local_130,fileName);
  cmGraphVizWriter::WriteTargetDependersFiles(&local_130,fileName);
  cmGraphVizWriter::WriteGlobalFile(&local_130,fileName);
  if (local_170[0] != local_160) {
    operator_delete(local_170[0],local_160[0] + 1);
  }
  if (local_150[0] != local_140) {
    operator_delete(local_150[0],local_140[0] + 1);
  }
  cmGraphVizWriter::~cmGraphVizWriter(&local_130);
  return;
}

Assistant:

void cmake::GenerateGraphViz(const char* fileName) const
{
#ifdef CMAKE_BUILD_WITH_CMAKE
  cmGraphVizWriter gvWriter(this->GetGlobalGenerator());

  std::string settingsFile = this->GetHomeOutputDirectory();
  settingsFile += "/CMakeGraphVizOptions.cmake";
  std::string fallbackSettingsFile = this->GetHomeDirectory();
  fallbackSettingsFile += "/CMakeGraphVizOptions.cmake";

  gvWriter.ReadSettings(settingsFile.c_str(), fallbackSettingsFile.c_str());

  gvWriter.WritePerTargetFiles(fileName);
  gvWriter.WriteTargetDependersFiles(fileName);
  gvWriter.WriteGlobalFile(fileName);

#endif
}